

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

bool __thiscall cmCustomCommandGenerator::HasOnlyEmptyCommandLines(cmCustomCommandGenerator *this)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  long lVar6;
  bool bVar7;
  
  pcVar1 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1;
  if (lVar2 == 0) {
    bVar7 = true;
  }
  else {
    uVar3 = (lVar2 >> 3) * -0x5555555555555555;
    bVar7 = false;
    uVar4 = 0;
    do {
      lVar2 = *(long *)&pcVar1[uVar4].
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      lVar6 = (long)*(pointer *)
                     ((long)&pcVar1[uVar4].
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 8) - lVar2;
      if (lVar6 != 0) {
        lVar6 = lVar6 >> 5;
        lVar6 = lVar6 + (ulong)(lVar6 == 0);
        plVar5 = (long *)(lVar2 + 8);
        do {
          if (*plVar5 != 0) {
            return bVar7;
          }
          plVar5 = plVar5 + 4;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      uVar4 = uVar4 + 1;
      bVar7 = uVar3 <= uVar4;
    } while (uVar4 != uVar3 + (uVar3 == 0));
  }
  return bVar7;
}

Assistant:

bool cmCustomCommandGenerator::HasOnlyEmptyCommandLines() const
{
  for (size_t i = 0; i < this->CommandLines.size(); ++i) {
    for (size_t j = 0; j < this->CommandLines[i].size(); ++j) {
      if (!this->CommandLines[i][j].empty()) {
        return false;
      }
    }
  }
  return true;
}